

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot.cpp
# Opt level: O0

bool ImPlot::BeginDragDropSource(ImGuiKeyModFlags key_mods,ImGuiDragDropFlags flags)

{
  bool bVar1;
  ImGuiIO *pIVar2;
  bool local_29;
  undefined1 local_28 [8];
  ImRect rect;
  ImGuiID ID;
  int i;
  ImGuiDragDropFlags flags_local;
  ImGuiKeyModFlags key_mods_local;
  
  pIVar2 = ImGui::GetIO();
  if (pIVar2->KeyMods == key_mods) {
    (GImPlot->CurrentPlot->XAxis).Dragging = false;
    for (rect.Max.y = 0.0; (int)rect.Max.y < 3; rect.Max.y = (float)((int)rect.Max.y + 1)) {
      GImPlot->CurrentPlot->YAxis[(int)rect.Max.y].Dragging = false;
    }
  }
  rect.Max.x = (float)ImGuiWindow::GetID(GImGui->CurrentWindow,0x990f3e);
  local_28 = *(undefined1 (*) [8])&(GImPlot->CurrentPlot->PlotRect).Min;
  rect.Min = (GImPlot->CurrentPlot->PlotRect).Max;
  bVar1 = ImGui::ItemAdd((ImRect *)local_28,(ImGuiID)rect.Max.x,(ImRect *)local_28,0);
  local_29 = false;
  if (bVar1) {
    local_29 = BeginDragDropSourceEx
                         ((ImGuiID)rect.Max.x,(bool)(GImPlot->CurrentPlot->PlotHovered & 1),flags,
                          key_mods);
  }
  return local_29;
}

Assistant:

bool BeginDragDropSource(ImGuiKeyModFlags key_mods, ImGuiDragDropFlags flags) {
    if (ImGui::GetIO().KeyMods == key_mods) {
        GImPlot->CurrentPlot->XAxis.Dragging = false;
        for (int i = 0; i < IMPLOT_Y_AXES; ++i)
            GImPlot->CurrentPlot->YAxis[i].Dragging = false;
    }
    const ImGuiID ID = GImGui->CurrentWindow->GetID(IMPLOT_ID_PLT);
    ImRect rect = GImPlot->CurrentPlot->PlotRect;
    return  ImGui::ItemAdd(rect, ID, &rect) && BeginDragDropSourceEx(ID, GImPlot->CurrentPlot->PlotHovered, flags, key_mods);
}